

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>_> *matchers,
               tuple<int,_int> *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Matcher<int>,_Matcher<int>_>_> *p_Var2;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var3;
  ostream *poVar4;
  MatcherBase<int> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  undefined1 local_38 [4];
  Value value;
  type matcher;
  ostream *os_local;
  tuple<int,_int> *values_local;
  tuple<testing::Matcher<int>,_testing::Matcher<int>_> *matchers_local;
  
  matcher.super_MatcherBase<int>.impl_.link_.next_ = (linked_ptr_internal *)os;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int>>
            (matchers,values,os);
  p_Var2 = std::get<0ul,testing::Matcher<int>,testing::Matcher<int>>(matchers);
  Matcher<int>::Matcher((Matcher<int> *)local_38,p_Var2);
  p_Var3 = std::get<0ul,int,int>(values);
  listener._404_4_ = *p_Var3;
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<int>::MatchAndExplain
                    ((MatcherBase<int> *)local_38,listener._404_4_,(MatchResultListener *)local_1d8)
  ;
  if (!bVar1) {
    poVar4 = std::operator<<((ostream *)matcher.super_MatcherBase<int>.impl_.link_.next_,
                             "  Expected arg #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    std::operator<<(poVar4,": ");
    this = &std::get<0ul,testing::Matcher<int>,testing::Matcher<int>>(matchers)->
            super_MatcherBase<int>;
    MatcherBase<int>::DescribeTo(this,(ostream *)matcher.super_MatcherBase<int>.impl_.link_.next_);
    std::operator<<((ostream *)matcher.super_MatcherBase<int>.impl_.link_.next_,
                    "\n           Actual: ");
    UniversalPrint<int>((int *)&listener.field_0x194,
                        (ostream *)matcher.super_MatcherBase<int>.impl_.link_.next_);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,(ostream *)matcher.super_MatcherBase<int>.impl_.link_.next_);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)matcher.super_MatcherBase<int>.impl_.link_.next_,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<int>::~Matcher((Matcher<int> *)local_38);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }